

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PgHdr * pcacheMergeDirtyList(PgHdr *pA,PgHdr *pB)

{
  PgHdr *pPVar1;
  bool bVar2;
  PgHdr result;
  
  bVar2 = pA != (PgHdr *)0x0;
  if (pB == (PgHdr *)0x0 || pA == (PgHdr *)0x0) {
    pPVar1 = &result;
  }
  else {
    pPVar1 = &result;
    do {
      if (pA->pgno < pB->pgno) {
        pPVar1->pDirty = pA;
        pPVar1 = pA;
        pA = pA->pDirty;
      }
      else {
        pPVar1->pDirty = pB;
        pPVar1 = pB;
        pB = pB->pDirty;
      }
      bVar2 = pA != (PgHdr *)0x0;
    } while ((bVar2) && (pB != (PgHdr *)0x0));
  }
  if (!bVar2) {
    pA = pB;
  }
  pPVar1->pDirty = pA;
  return result.pDirty;
}

Assistant:

static PgHdr *pcacheMergeDirtyList(PgHdr *pA, PgHdr *pB){
  PgHdr result, *pTail;
  pTail = &result;
  while( pA && pB ){
    if( pA->pgno<pB->pgno ){
      pTail->pDirty = pA;
      pTail = pA;
      pA = pA->pDirty;
    }else{
      pTail->pDirty = pB;
      pTail = pB;
      pB = pB->pDirty;
    }
  }
  if( pA ){
    pTail->pDirty = pA;
  }else if( pB ){
    pTail->pDirty = pB;
  }else{
    pTail->pDirty = 0;
  }
  return result.pDirty;
}